

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O3

void concept_suite::bidirectional_iterator_decrementable(void)

{
  bool bVar1;
  iterator_type *this;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> data;
  circular_view<int,_18446744073709551615UL> span;
  iterator a;
  vector<int,_std::allocator<int>_> local_70;
  circular_view<int,_18446744073709551615UL> local_58;
  basic_iterator<int> local_38;
  iterator_type local_28;
  
  local_58.member.data = (pointer)0x160000000b;
  local_58.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_58;
  std::vector<int,_std::allocator<int>_>::vector(&local_70,__l,(allocator_type *)&local_38);
  local_58.member.data = (pointer)0x0;
  if ((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_58.member.data =
         local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_58.member.cap =
       (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  local_38.current = 0;
  local_58.member.size = local_58.member.cap;
  local_58.member.next = local_58.member.cap;
  local_38.parent = &local_58;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_38);
  this = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator--
                   (&local_38);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (this,&local_38);
  boost::detail::test_impl
            ("b == a",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x9c,"void concept_suite::bidirectional_iterator_decrementable()",bVar1);
  local_28.current = local_58.member.cap * 2;
  if ((local_28.current & local_58.member.cap * 2 - 1) == 0) {
    local_28.current = local_28.current - 1 & local_58.member.next - local_58.member.size;
  }
  else {
    local_28.current = (local_58.member.next - local_58.member.size) % local_28.current;
  }
  local_28.parent = &local_58;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (this,&local_28);
  boost::detail::test_impl
            ("b == span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x9d,"void concept_suite::bidirectional_iterator_decrementable()",bVar1);
  if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void bidirectional_iterator_decrementable()
{
    std::vector<int> data = { 11, 22, 33, 44 };
    circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::iterator a = span.begin();
    ++a;
    circular_view<int>::iterator& b = --a;
    BOOST_TEST(b == a);
    BOOST_TEST(b == span.begin());
}